

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset_test.c
# Opt level: O0

void process_reset_test(int converter)

{
  char *pcVar1;
  int local_60;
  uint local_5c;
  int error;
  int k;
  SRC_DATA src_data;
  SRC_STATE *src_state;
  int converter_local;
  
  pcVar1 = src_get_name(converter);
  printf("\tprocess_reset_test  (%-28s) ....... ",pcVar1);
  fflush(_stdout);
  for (local_5c = 0; (int)local_5c < 0x800; local_5c = local_5c + 1) {
    data_one[(int)local_5c] = 1.0;
    data_zero[(int)local_5c] = 0.0;
  }
  src_data.src_ratio = (double)src_new(converter,1,&local_60);
  if ((SRC_STATE *)src_data.src_ratio == (SRC_STATE *)0x0) {
    pcVar1 = src_strerror(local_60);
    printf("\n\nLine %d : src_new() failed : %s.\n\n",0x45,pcVar1);
    exit(1);
  }
  _error = data_one;
  src_data.data_in = process_reset_test::output;
  src_data.data_out = (float *)0x800;
  src_data.input_frames = 0x800;
  src_data.end_of_input = -0x33333333;
  src_data._52_4_ = 0x3feccccc;
  src_data.output_frames_gen._0_4_ = 1;
  local_60 = src_process((SRC_STATE *)src_data.src_ratio,(SRC_DATA *)&error);
  if (local_60 != 0) {
    pcVar1 = src_strerror(local_60);
    printf("\n\nLine %d : src_simple () returned error : %s\n\n",0x52,pcVar1);
    exit(1);
  }
  src_reset((SRC_STATE *)src_data.src_ratio);
  _error = data_zero;
  src_data.data_in = process_reset_test::output;
  src_data.data_out = (float *)0x800;
  src_data.input_frames = 0x800;
  src_data.end_of_input = -0x33333333;
  src_data._52_4_ = 0x3feccccc;
  src_data.output_frames_gen._0_4_ = 1;
  local_60 = src_process((SRC_STATE *)src_data.src_ratio,(SRC_DATA *)&error);
  if (local_60 != 0) {
    pcVar1 = src_strerror(local_60);
    printf("\n\nLine %d : src_simple () returned error : %s\n\n",0x62,pcVar1);
    exit(1);
  }
  local_5c = 0;
  while( true ) {
    if (0x3ff < (int)local_5c) {
      src_set_ratio((SRC_STATE *)src_data.src_ratio,1.0);
      src_data.src_ratio = (double)src_delete((SRC_STATE *)src_data.src_ratio);
      puts("ok");
      return;
    }
    if ((process_reset_test::output[(int)local_5c] != 0.0) ||
       (NAN(process_reset_test::output[(int)local_5c]))) break;
    local_5c = local_5c + 1;
  }
  printf("\n\nLine %d : output [%d] should be 0.0, is %f.\n",
         (double)process_reset_test::output[(int)local_5c],0x69,(ulong)local_5c);
  exit(1);
}

Assistant:

static void
process_reset_test (int converter)
{	static float output [BUFFER_LEN] ;

	SRC_STATE *src_state ;
	SRC_DATA src_data ;
	int k, error ;

	printf ("\tprocess_reset_test  (%-28s) ....... ", src_get_name (converter)) ;
	fflush (stdout) ;

	for (k = 0 ; k < BUFFER_LEN ; k++)
	{	data_one [k] = 1.0 ;
		data_zero [k] = 0.0 ;
		} ;

	/* Get a converter. */
	if ((src_state = src_new (converter, 1, &error)) == NULL)
	{	printf ("\n\nLine %d : src_new() failed : %s.\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	/* Process a bunch of 1.0 valued samples. */
	src_data.data_in		= data_one ;
	src_data.data_out		= output ;
	src_data.input_frames	= BUFFER_LEN ;
	src_data.output_frames	= BUFFER_LEN ;
	src_data.src_ratio		= 0.9 ;
	src_data.end_of_input	= 1 ;

	if ((error = src_process (src_state, &src_data)) != 0)
	{	printf ("\n\nLine %d : src_simple () returned error : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	/* Reset the state of the converter.*/
	src_reset (src_state) ;

	/* Now process some zero data. */
	src_data.data_in		= data_zero ;
	src_data.data_out		= output ;
	src_data.input_frames	= BUFFER_LEN ;
	src_data.output_frames	= BUFFER_LEN ;
	src_data.src_ratio		= 0.9 ;
	src_data.end_of_input	= 1 ;

	if ((error = src_process (src_state, &src_data)) != 0)
	{	printf ("\n\nLine %d : src_simple () returned error : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	/* Finally make sure that the output data is zero ie reset was successful. */
	for (k = 0 ; k < BUFFER_LEN / 2 ; k++)
		if (output [k] != 0.0)
		{	printf ("\n\nLine %d : output [%d] should be 0.0, is %f.\n", __LINE__, k, output [k]) ;
			exit (1) ;
			} ;

	/* Make sure that this function has been exported. */
	src_set_ratio (src_state, 1.0) ;

	/* Delete converter. */
	src_state = src_delete (src_state) ;

	puts ("ok") ;
}